

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O2

Proto * luaU_undump(lua_State *L,ZIO *Z,Mbuffer *buff,char *name)

{
  char cVar1;
  int iVar2;
  TString *p;
  Proto *pPVar3;
  LoadState local_58;
  undefined4 local_38;
  undefined8 local_34;
  undefined1 local_2c [12];
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_38 = 0x61754c1b;
  local_34 = 0x8040804010051;
  local_58.L = L;
  local_58.Z = Z;
  local_58.b = buff;
  local_58.name = name;
  LoadBlock(&local_58,local_2c,0xc);
  iVar2 = bcmp(&local_38,local_2c,0xc);
  if (iVar2 != 0) {
    error(&local_58,"bad header");
  }
  p = luaS_newlstr(L,"=?",2);
  pPVar3 = LoadFunction(&local_58,p);
  return pPVar3;
}

Assistant:

Proto* luaU_undump (lua_State* L, ZIO* Z, Mbuffer* buff, const char* name)
{
 LoadState S;
 if (*name=='@' || *name=='=')
  S.name=name+1;
 else if (*name==LUA_SIGNATURE[0])
  S.name="binary string";
 else
  S.name=name;
 S.L=L;
 S.Z=Z;
 S.b=buff;
 LoadHeader(&S);
 return LoadFunction(&S,luaS_newliteral(L,"=?"));
}